

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_hadamard_lp_16x16_avx2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*in_RDX) [32];
  int16_t *in_RSI;
  __m256i b3;
  __m256i b2;
  __m256i b1;
  __m256i b0;
  __m256i coeff3;
  __m256i coeff2;
  __m256i coeff1;
  __m256i coeff0;
  int idx_1;
  int16_t *src_ptr;
  int idx;
  int16_t *t_coeff;
  int local_494;
  int local_484;
  undefined1 (*src_stride_00) [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  
  src_stride_00 = in_RDX;
  for (local_484 = 0; local_484 < 2; local_484 = local_484 + 1) {
    aom_hadamard_lp_8x8_dual_avx2(in_RSI,(ptrdiff_t)src_stride_00,(int16_t *)in_RDX);
  }
  for (local_494 = 0; local_494 < 0x40; local_494 = local_494 + 0x10) {
    auVar1 = vpaddw_avx2(*in_RDX,in_RDX[4]);
    auVar4 = vpsubw_avx2(*in_RDX,in_RDX[4]);
    auVar2 = vpaddw_avx2(in_RDX[8],in_RDX[0xc]);
    auVar5 = vpsubw_avx2(in_RDX[8],in_RDX[0xc]);
    auVar3 = vpsraw_avx2(auVar1,ZEXT416(1));
    auVar4 = vpsraw_avx2(auVar4,ZEXT416(1));
    auVar2 = vpsraw_avx2(auVar2,ZEXT416(1));
    auVar5 = vpsraw_avx2(auVar5,ZEXT416(1));
    auVar1 = vpaddw_avx2(auVar3,auVar2);
    local_380 = auVar1._0_8_;
    uStack_378 = auVar1._8_8_;
    uStack_370 = auVar1._16_8_;
    uStack_368 = auVar1._24_8_;
    *(undefined8 *)*src_stride_00 = local_380;
    *(undefined8 *)(*src_stride_00 + 8) = uStack_378;
    *(undefined8 *)(*src_stride_00 + 0x10) = uStack_370;
    *(undefined8 *)(*src_stride_00 + 0x18) = uStack_368;
    auVar1 = vpaddw_avx2(auVar4,auVar5);
    local_3c0 = auVar1._0_8_;
    uStack_3b8 = auVar1._8_8_;
    uStack_3b0 = auVar1._16_8_;
    uStack_3a8 = auVar1._24_8_;
    *(undefined8 *)src_stride_00[4] = local_3c0;
    *(undefined8 *)(src_stride_00[4] + 8) = uStack_3b8;
    *(undefined8 *)(src_stride_00[4] + 0x10) = uStack_3b0;
    *(undefined8 *)(src_stride_00[4] + 0x18) = uStack_3a8;
    auVar1 = vpsubw_avx2(auVar3,auVar2);
    local_400 = auVar1._0_8_;
    uStack_3f8 = auVar1._8_8_;
    uStack_3f0 = auVar1._16_8_;
    uStack_3e8 = auVar1._24_8_;
    *(undefined8 *)src_stride_00[8] = local_400;
    *(undefined8 *)(src_stride_00[8] + 8) = uStack_3f8;
    *(undefined8 *)(src_stride_00[8] + 0x10) = uStack_3f0;
    *(undefined8 *)(src_stride_00[8] + 0x18) = uStack_3e8;
    auVar1 = vpsubw_avx2(auVar4,auVar5);
    local_440 = auVar1._0_8_;
    uStack_438 = auVar1._8_8_;
    uStack_430 = auVar1._16_8_;
    uStack_428 = auVar1._24_8_;
    *(undefined8 *)src_stride_00[0xc] = local_440;
    *(undefined8 *)(src_stride_00[0xc] + 8) = uStack_438;
    *(undefined8 *)(src_stride_00[0xc] + 0x10) = uStack_430;
    *(undefined8 *)(src_stride_00[0xc] + 0x18) = uStack_428;
    src_stride_00 = src_stride_00 + 1;
    in_RDX = in_RDX + 1;
  }
  return;
}

Assistant:

void aom_hadamard_lp_16x16_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                                int16_t *coeff) {
  int16_t *t_coeff = coeff;
  for (int idx = 0; idx < 2; ++idx) {
    const int16_t *src_ptr = src_diff + idx * 8 * src_stride;
    aom_hadamard_lp_8x8_dual_avx2(src_ptr, src_stride,
                                  t_coeff + (idx * 64 * 2));
  }

  for (int idx = 0; idx < 64; idx += 16) {
    const __m256i coeff0 = _mm256_loadu_si256((const __m256i *)t_coeff);
    const __m256i coeff1 = _mm256_loadu_si256((const __m256i *)(t_coeff + 64));
    const __m256i coeff2 = _mm256_loadu_si256((const __m256i *)(t_coeff + 128));
    const __m256i coeff3 = _mm256_loadu_si256((const __m256i *)(t_coeff + 192));

    __m256i b0 = _mm256_add_epi16(coeff0, coeff1);
    __m256i b1 = _mm256_sub_epi16(coeff0, coeff1);
    __m256i b2 = _mm256_add_epi16(coeff2, coeff3);
    __m256i b3 = _mm256_sub_epi16(coeff2, coeff3);

    b0 = _mm256_srai_epi16(b0, 1);
    b1 = _mm256_srai_epi16(b1, 1);
    b2 = _mm256_srai_epi16(b2, 1);
    b3 = _mm256_srai_epi16(b3, 1);
    _mm256_storeu_si256((__m256i *)coeff, _mm256_add_epi16(b0, b2));
    _mm256_storeu_si256((__m256i *)(coeff + 64), _mm256_add_epi16(b1, b3));
    _mm256_storeu_si256((__m256i *)(coeff + 128), _mm256_sub_epi16(b0, b2));
    _mm256_storeu_si256((__m256i *)(coeff + 192), _mm256_sub_epi16(b1, b3));
    coeff += 16;
    t_coeff += 16;
  }
}